

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatusBar.cpp
# Opt level: O2

void __thiscall StatusBar::drawSelf(StatusBar *this,PixelGameEngine *pge)

{
  int32_t iVar1;
  Pixel col;
  float alpha;
  vf2d local_88;
  float local_7c;
  undefined1 local_78 [32];
  undefined1 local_58 [40];
  
  iVar1 = olc::PixelGameEngine::ScreenWidth(pge);
  local_78._0_4_ = (float)(iVar1 / 2) + -18.0;
  local_78._4_4_ = 4.0;
  local_58._0_4_ = 36.0;
  local_58._4_4_ = 12.0;
  olc::PixelGameEngine::FillRectDecal
            (pge,(vf2d *)local_78,(vf2d *)local_58,(Pixel)olc::BLUE.field_1);
  iVar1 = olc::PixelGameEngine::ScreenWidth(pge);
  local_88.y = 6.0;
  local_88.x = (float)(iVar1 / 2) + -16.0;
  std::__cxx11::to_string((string *)local_58,this->progress / 1000);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (string *)local_58,"%");
  local_58._32_8_ = 0x3f8000003f800000;
  olc::PixelGameEngine::DrawStringDecal
            (pge,&local_88,(string *)local_78,(Pixel)olc::WHITE.field_1,(vf2d *)(local_58 + 0x20));
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_58);
  iVar1 = olc::PixelGameEngine::ScreenWidth(pge);
  local_7c = (float)iVar1 * 0.5;
  olc::PixelGameEngine::GetTextSize((PixelGameEngine *)local_58,(string *)pge);
  local_78._0_4_ = local_7c - (float)((int)local_58._0_4_ / 2);
  local_78._4_4_ = 30.0;
  alpha = this->visibilityAmount;
  if (this->visibilityAmount <= 0.0) {
    alpha = 0.0;
  }
  if (1.0 <= alpha) {
    alpha = 1.0;
  }
  col = olc::PixelF(1.0,0.0,0.0,alpha);
  local_88.x = 1.0;
  local_88.y = 1.0;
  olc::PixelGameEngine::DrawStringDecal(pge,(vf2d *)local_78,&this->currentJoke,col,&local_88);
  return;
}

Assistant:

void StatusBar::drawSelf(olc::PixelGameEngine *pge) const {
    pge->FillRectDecal({pge->ScreenWidth() / 2 - 18.0f, 4}, {36, 12}, olc::BLUE);
    pge->DrawStringDecal({pge->ScreenWidth() / 2 - 16.0f, 6}, std::to_string(progress / 1000) + "%");
    pge->DrawStringDecal(
	    {pge->ScreenWidth() / 2.0f - pge->GetTextSize(currentJoke).x / 2, 30},
	    currentJoke,
	    olc::PixelF(1.0f, 0.0f, 0.0f, std::min(1.0f, std::max(0.0f, visibilityAmount)))
	    );
}